

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O1

void __thiscall
jhu::thrax::LabelTests_PrintHieroMixed_Test::TestBody(LabelTests_PrintHieroMixed_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RCX;
  long lVar3;
  char *message;
  string_view line;
  AssertionResult gtest_ar;
  AlignedSentencePair asp;
  PhrasalRule rule;
  ostringstream s;
  AssertHelper AStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  internal local_260 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  AlignedSentencePair local_250;
  PhrasalRule local_208;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"a c\tb d\t0-0";
  readAlignedSentencePair<false,false>(&local_250,(thrax *)&DAT_0000000b,line);
  std::__cxx11::ostringstream::ostringstream(local_180);
  lVar3 = 0x10;
  do {
    *(undefined8 *)((long)local_208.nts._M_elems + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)local_208.nts._M_elems + lVar3 + -8) = 0;
    *(undefined8 *)((long)local_208.nts._M_elems + lVar3 + -8) = 1;
    *(char **)((long)&local_208.nts._M_elems[0].span.src.start + lVar3) = "X";
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x70);
  local_208.lhs.span =
       (SpanPair)
       ((ulong)(((int)local_250.src.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                 (int)local_250.src.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start & 0xfffffff0U) << 0xc) |
       (ulong)(uint)((int)local_250.tgt.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (int)local_250.tgt.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) << 0x2c);
  local_208.nextNT = 0;
  local_208.lhs.label._M_len = 1;
  local_208.lhs.label._M_str = "X";
  local_208.nts._M_elems[0].span.src.start = 0;
  local_208.nts._M_elems[0].span.src.end = 1;
  local_208.nts._M_elems[0].span.tgt.start = 1;
  local_208.nts._M_elems[0].span.tgt.end = 2;
  local_208.nts._M_elems[0].label._M_len = 1;
  local_208.nts._M_elems[0].label._M_str = "X";
  local_280._M_dataplus._M_p._0_1_ = 0x5b;
  local_208.sentence = &local_250;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_180,(char *)&local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"X",1);
  local_280._M_dataplus._M_p._0_1_ = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,(char *)&local_280,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,"\t",1);
  printRhs<true>((ostream *)local_180,&local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,"\t",1);
  printRhs<false>((ostream *)local_180,&local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,"\t",1);
  PhrasalRule::printAlignment(&local_208,(ostream *)local_180);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            (local_260,"\"[X]\\t[X,1] c\\tb [X,1]\\t\"","s.str()",
             (char (*) [21])"[X]\t[X,1] c\tb [X,1]\t",&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_280);
    if (local_258.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_258.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x3c,message);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&AStack_288);
    if ((long *)local_280._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_280._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_280._M_dataplus._M_p + 8))();
      }
      local_280._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_258,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  if (local_250.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.alignment.
                    super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.alignment.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.alignment.
                          super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.tgt.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.tgt.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.tgt.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.tgt.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.src.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.src.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.src.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.src.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(LabelTests, PrintHieroMixed) {
  auto asp = readAlignedSentencePair<false, false>("a c\tb d\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts[0] = NT({{0, 1}, {1, 2}}, "X");
  auto nt = rule.nts.front().span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1] c\tb [X,1]\t", s.str());
}